

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  ostream *poVar1;
  int64_t j;
  long lVar2;
  
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 5;
  for (lVar2 = 0; lVar2 < (long)(v->data_).size_; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(os,(v->data_).mem_[lVar2]);
    std::operator<<(poVar1,' ');
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v) {
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.size(); j++) {
    os << v[j] << ' ';
  }
  return os;
}